

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O3

int __thiscall MediaManager::GetTypeFromBuffer(MediaManager *this,uchar *buffer,int size)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (*(long *)buffer == 0x414e53202d20564d) {
    iVar1 = 1;
  }
  else {
    if (*(long *)buffer == 0x524e53202d205752) {
      return 5;
    }
    iVar1 = 3;
    if ((((((*(long *)buffer != 0x435043202d20564d) && (*(long *)buffer != 0x4445444e45545845)) &&
          (buffer[2] != 'P' || *(short *)buffer != 0x4353)) &&
         (((*(int *)buffer != 0x53504143 && (*(long *)buffer != 0x4546434950435848)) &&
          (iVar1 = 4, *(int *)(buffer + 3) != 0x21657061 || *(int *)buffer != 0x6154585a)))) &&
        (((size < 0xc || (*(int *)buffer != 0x46464952)) || (*(int *)(buffer + 8) != 0x45564157))))
       && ((auVar4[0] = -(buffer[6] == 's'), auVar4[1] = -(buffer[7] == 's'),
           auVar4[2] = -(buffer[8] == 'e'), auVar4[3] = -(buffer[9] == 'd'),
           auVar4[4] = -(buffer[10] == ' '), auVar4[5] = -(buffer[0xb] == 'S'),
           auVar4[6] = -(buffer[0xc] == 'q'), auVar4[7] = -(buffer[0xd] == 'u'),
           auVar4[8] = -(buffer[0xe] == 'a'), auVar4[9] = -(buffer[0xf] == 'r'),
           auVar4[10] = -(buffer[0x10] == 'e'), auVar4[0xb] = -(buffer[0x11] == ' '),
           auVar4[0xc] = -(buffer[0x12] == 'W'), auVar4[0xd] = -(buffer[0x13] == 'a'),
           auVar4[0xe] = -(buffer[0x14] == 'v'), auVar4[0xf] = -(buffer[0x15] == 'e'),
           auVar2[0] = -(*buffer == 'C'), auVar2[1] = -(buffer[1] == 'o'),
           auVar2[2] = -(buffer[2] == 'm'), auVar2[3] = -(buffer[3] == 'p'),
           auVar2[4] = -(buffer[4] == 'r'), auVar2[5] = -(buffer[5] == 'e'),
           auVar2[6] = -(buffer[6] == 's'), auVar2[7] = -(buffer[7] == 's'),
           auVar2[8] = -(buffer[8] == 'e'), auVar2[9] = -(buffer[9] == 'd'),
           auVar2[10] = -(buffer[10] == ' '), auVar2[0xb] = -(buffer[0xb] == 'S'),
           auVar2[0xc] = -(buffer[0xc] == 'q'), auVar2[0xd] = -(buffer[0xd] == 'u'),
           auVar2[0xe] = -(buffer[0xe] == 'a'), auVar2[0xf] = -(buffer[0xf] == 'r'),
           auVar2 = auVar2 & auVar4,
           (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) != 0xffff &&
           (auVar5[0] = -(buffer[3] == 'a'), auVar5[1] = -(buffer[4] == 't'),
           auVar5[2] = -(buffer[5] == 'i'), auVar5[3] = -(buffer[6] == 'v'),
           auVar5[4] = -(buffer[7] == 'e'), auVar5[5] = -(buffer[8] == ' '),
           auVar5[6] = -(buffer[9] == 'V'), auVar5[7] = -(buffer[10] == 'o'),
           auVar5[8] = -(buffer[0xb] == 'i'), auVar5[9] = -(buffer[0xc] == 'c'),
           auVar5[10] = -(buffer[0xd] == 'e'), auVar5[0xb] = -(buffer[0xe] == ' '),
           auVar5[0xc] = -(buffer[0xf] == 'F'), auVar5[0xd] = -(buffer[0x10] == 'i'),
           auVar5[0xe] = -(buffer[0x11] == 'l'), auVar5[0xf] = -(buffer[0x12] == 'e'),
           auVar3[0] = -(*buffer == 'C'), auVar3[1] = -(buffer[1] == 'r'),
           auVar3[2] = -(buffer[2] == 'e'), auVar3[3] = -(buffer[3] == 'a'),
           auVar3[4] = -(buffer[4] == 't'), auVar3[5] = -(buffer[5] == 'i'),
           auVar3[6] = -(buffer[6] == 'v'), auVar3[7] = -(buffer[7] == 'e'),
           auVar3[8] = -(buffer[8] == ' '), auVar3[9] = -(buffer[9] == 'V'),
           auVar3[10] = -(buffer[10] == 'o'), auVar3[0xb] = -(buffer[0xb] == 'i'),
           auVar3[0xc] = -(buffer[0xc] == 'c'), auVar3[0xd] = -(buffer[0xd] == 'e'),
           auVar3[0xe] = -(buffer[0xe] == ' '), auVar3[0xf] = -(buffer[0xf] == 'F'),
           auVar3 = auVar3 & auVar5,
           (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) != 0xffff)))) {
      if (((0xb < size) && (*(int *)(buffer + 8) == 0x21534d41)) && (*(int *)buffer == 0x46464952))
      {
        return 8;
      }
      return 0;
    }
  }
  return iVar1;
}

Assistant:

int MediaManager::GetTypeFromBuffer(unsigned char* buffer, int size)
{
   if (memcmp(buffer, "MV - SNA", 8) == 0)
      return MEDIA_SNA;
   else if (memcmp(buffer, "RW - SNR", 8) == 0)
      return MEDIA_SNR;
   else if ((memcmp(buffer, "MV - CPC", 8) == 0)
      || (memcmp(buffer, "EXTENDED", 8) == 0)
      || (memcmp(buffer, "SCP", 3) == 0)
      || (memcmp(buffer, "CAPS", 4) == 0)
      || (memcmp(buffer, "HXCPICFE", 8) == 0)
#ifdef SUPPORT_SFWR
      || (memcmp(buffer, "FORM", 4) == 0)
#endif
   )
      // SNA, ROM or DSK ?
      return MEDIA_DISK;
      // Tape : CDT, TAP
   else if ((memcmp(buffer, "ZXTape!", 7) == 0)
      || (size >= 12 && (memcmp(buffer, "RIFF", 4) == 0) && (memcmp(&buffer[8], "WAVE", 4) == 0))
      || (memcmp(buffer, "Compressed Square Wave", 22) == 0)
      || (memcmp(buffer, "Creative Voice File", 19) == 0)
   )
      return MEDIA_TAPE;
   else if (size >= 12 && (memcmp(&buffer[8], "AMS!", 4) == 0) && (memcmp(&buffer[0], "RIFF", 4) == 0))
   {
      return MEDIA_CPR;
   }
   else return MEDIA_UNDEF;
}